

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O3

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  pointer *pppIVar1;
  iterator iVar2;
  BasicBlock *pBVar3;
  pointer pOVar4;
  LoopUnrollerUtilsImpl *pLVar5;
  pointer ppBVar6;
  pointer puVar7;
  pointer ppIVar8;
  IRContext *this_00;
  undefined8 uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  mapped_type *pmVar12;
  uint32_t operand_label;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  Instruction **extraout_RDX_01;
  Instruction **extraout_RDX_02;
  Instruction **__args;
  ulong uVar14;
  Instruction *pIVar15;
  pointer ppIVar16;
  ulong uVar17;
  Instruction *inst;
  Instruction *pIVar18;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *block_itr;
  pointer ppBVar19;
  pointer puVar20;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  Instruction *merge_inst;
  uint32_t local_6c;
  undefined1 local_68 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_48;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  Instruction *local_38;
  
  Unroll(this,loop,this->number_of_loop_iterations_);
  FoldConditionBlock(this,this->loop_condition_block_,operand_label);
  local_38 = BasicBlock::GetLoopMergeInst(loop->loop_header_);
  iVar2._M_current =
       (this->invalidated_instructions_).
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->invalidated_instructions_).
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    _M_realloc_insert<spvtools::opt::Instruction*const&>
              ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &this->invalidated_instructions_,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = local_38;
    pppIVar1 = &(this->invalidated_instructions_).
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pBVar3 = (this->state_).previous_latch_block_;
  pIVar18 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar18 == (Instruction *)0x0) ||
     ((pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  pIVar18 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  pIVar15 = (loop->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  if (pIVar15->has_result_id_ == true) {
    local_68._16_4_ = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  local_68._24_8_ = local_68 + 0x10;
  local_68._0_8_ = &PTR__SmallVector_003d7c78;
  local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_68._8_8_ = (pointer)0x1;
  uVar17 = (ulong)(pIVar18->has_result_id_ & 1) + 1;
  if (pIVar18->has_type_id_ == false) {
    uVar17 = (ulong)pIVar18->has_result_id_;
  }
  pOVar4 = (pIVar18->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar14 = ((long)(pIVar18->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
           -0x5555555555555555;
  if (uVar17 <= uVar14 && uVar14 - uVar17 != 0) {
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)((pOVar4->words).buffer + 0xfffffffffffffffc) +
               (ulong)(uint)((int)uVar17 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_68);
    local_68._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_48,local_48._M_head_impl);
    }
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::UpdateDefUse
                ((this->context_->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,pIVar18);
    }
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_68._16_4_ = (array<signed_char,_4UL>)0x0;
    local_68._20_4_ = (array<signed_char,_4UL>)0x0;
    Loop::GetInductionVariables
              (loop,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_68);
    local_40 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&(this->state_).new_inst;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_40);
    uVar9 = local_68._8_8_;
    uVar13 = extraout_RDX;
    for (ppIVar16 = (pointer)local_68._0_8_; uVar10 = (uint32_t)uVar13, ppIVar16 != (pointer)uVar9;
        ppIVar16 = ppIVar16 + 1) {
      pLVar5 = (LoopUnrollerUtilsImpl *)*ppIVar16;
      pIVar18 = (loop->loop_preheader_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar11 = 0;
      pIVar15 = (Instruction *)0x0;
      if (pIVar18->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
        pIVar15 = (Instruction *)(ulong)uVar10;
        uVar10 = extraout_EDX;
      }
      uVar10 = GetPhiDefID(pLVar5,pIVar15,uVar10);
      if (*(char *)((long)&(pLVar5->invalidated_instructions_).
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + 5) == '\x01') {
        uVar11 = Instruction::GetSingleWordOperand
                           ((Instruction *)pLVar5,
                            (uint)*(byte *)((long)&(pLVar5->invalidated_instructions_).
                                                                                                      
                                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
      }
      local_6c = uVar11;
      pmVar12 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_40,&local_6c);
      *pmVar12 = uVar10;
      uVar13 = extraout_RDX_00;
    }
    ppBVar6 = (this->loop_blocks_inorder_).
              super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar19 = (this->loop_blocks_inorder_).
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar19 != ppBVar6;
        ppBVar19 = ppBVar19 + 1) {
      pBVar3 = *ppBVar19;
      for (pIVar18 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar18 != &(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar18 = (pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        RemapOperands(this,pIVar18);
      }
    }
    puVar7 = (this->blocks_to_add_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar20 = (this->blocks_to_add_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar7;
        puVar20 = puVar20 + 1) {
      pBVar3 = (puVar20->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar18 = *(Instruction **)
                      ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x10);
          pIVar18 !=
          (Instruction *)
          ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar18 = (pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        RemapOperands(this,pIVar18);
      }
    }
    ppIVar8 = (this->state_).previous_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar16 = (this->state_).previous_phis_.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar16 != ppIVar8;
        ppIVar16 = ppIVar16 + 1) {
      RemapOperands(this,*ppIVar16);
    }
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
    }
    loop->loop_is_marked_for_removal_ = true;
    if (loop->parent_ != (Loop *)0x0) {
      AddBlocksToLoop(this,loop->parent_);
    }
    AddBlocksToFunction(this,loop->loop_merge_);
    IRContext::InvalidateAnalysesExceptFor
              (this->context_,kAnalysisLoopAnalysis|kAnalysisInstrToBlockMapping|kAnalysisBegin);
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_68._16_4_ = (array<signed_char,_4UL>)0x0;
    local_68._20_4_ = (array<signed_char,_4UL>)0x0;
    Loop::GetInductionVariables
              (loop,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_68);
    if (local_68._8_8_ != local_68._0_8_) {
      uVar17 = 0;
      __args = extraout_RDX_01;
      do {
        uVar10 = (uint32_t)__args;
        pLVar5 = (LoopUnrollerUtilsImpl *)
                 (this->state_).previous_phis_.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17];
        pIVar18 = (((this->state_).previous_latch_block_)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pIVar15 = (Instruction *)0x0;
        if (pIVar18->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
          pIVar15 = (Instruction *)(ulong)uVar10;
          uVar10 = extraout_EDX_00;
        }
        uVar10 = GetPhiDefID(pLVar5,pIVar15,uVar10);
        this_00 = this->context_;
        pIVar18 = *(pointer)(local_68._0_8_ + uVar17 * 8);
        uVar11 = 0;
        if (pIVar18->has_result_id_ == true) {
          uVar11 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
        }
        IRContext::ReplaceAllUsesWith(this_00,uVar11,uVar10);
        __args = (Instruction **)(local_68._0_8_ + uVar17 * 8);
        iVar2._M_current =
             (this->invalidated_instructions_).
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->invalidated_instructions_).
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&this->invalidated_instructions_,iVar2,__args);
          __args = extraout_RDX_02;
        }
        else {
          *iVar2._M_current = *__args;
          pppIVar1 = &(this->invalidated_instructions_).
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)(local_68._8_8_ - local_68._0_8_) >> 3));
    }
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
    }
    ppIVar8 = (this->invalidated_instructions_).
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar16 = (this->invalidated_instructions_).
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar16 != ppIVar8;
        ppIVar16 = ppIVar16 + 1) {
      IRContext::KillInst(this->context_,*ppIVar16);
    }
    IRContext::InvalidateAnalysesExceptFor(this->context_,kAnalysisLoopAnalysis|kAnalysisBegin);
    return;
  }
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void LoopUnrollerUtilsImpl::FullyUnroll(Loop* loop) {
  // We unroll the loop by number of iterations in the loop.
  Unroll(loop, number_of_loop_iterations_);

  // The first condition block is preserved until now so it can be copied.
  FoldConditionBlock(loop_condition_block_, 1);

  // Delete the OpLoopMerge and remove the backedge to the header.
  CloseUnrolledLoop(loop);

  // Mark the loop for later deletion. This allows us to preserve the loop
  // iterators but still disregard dead loops.
  loop->MarkLoopForRemoval();

  // If the loop has a parent add the new blocks to the parent.
  if (loop->GetParent()) {
    AddBlocksToLoop(loop->GetParent());
  }

  // Add the blocks to the function.
  AddBlocksToFunction(loop->GetMergeBlock());

  ReplaceInductionUseWithFinalValue(loop);

  RemoveDeadInstructions();
  // Invalidate all analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse);
}